

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

void __thiscall
ghc::filesystem::path::path<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (path *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          first,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                last,format fmt)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RSI;
  format in_stack_ffffffffffffffa4;
  string_type *in_stack_ffffffffffffffa8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffc0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            (in_RDX,in_stack_ffffffffffffffc0,in_RSI,(allocator<char> *)in_stack_ffffffffffffffa8);
  path((path *)in_RDX,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffaf);
  return;
}

Assistant:

inline path::path(InputIterator first, InputIterator last, format fmt)
    : path(std::basic_string<typename std::iterator_traits<InputIterator>::value_type>(first, last), fmt)
{
    // delegated
}